

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Transpose::forward_impl
          (Transpose *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  uint uVar1;
  Tensor *pTVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  pointer ppTVar9;
  ulong uVar10;
  Index col;
  float *pfVar11;
  Index row;
  ulong uVar12;
  uint uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int iVar23;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Transpose<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_50;
  
  if ((((this->super_Node).dim.d[0] == 1) || ((this->super_Node).dim.nd < 2)) ||
     ((this->super_Node).dim.d[1] == 1)) {
    fx->v = (*(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->v;
  }
  else {
    ppTVar9 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (((*ppTVar9)->d).bd != 0) {
      uVar13 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        pTVar2 = *ppTVar9;
        uVar1 = (pTVar2->d).nd;
        iVar23 = 1;
        if ((ulong)uVar1 != 0) {
          auVar18 = vpbroadcastq_avx512f();
          uVar10 = 0;
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar20 = vmovdqa64_avx512f(auVar19);
            auVar19 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar19,auVar16);
            auVar19 = vporq_avx512f(auVar19,auVar17);
            uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar21,auVar18,2);
            bVar8 = (byte)uVar6;
            uVar14 = CONCAT11(bVar8,bVar7);
            auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar10));
            auVar21._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
            auVar21._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
            auVar21._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
            auVar21._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
            auVar21._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
            auVar21._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
            auVar21._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
            auVar21._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
            auVar21._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
            auVar21._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
            auVar21._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
            auVar21._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
            auVar21._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
            auVar21._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
            auVar21._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
            auVar21._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
            auVar19 = vpmulld_avx512f(auVar21,auVar20);
            uVar10 = uVar10 + 0x10;
          } while (((ulong)uVar1 + 0xf & 0x1fffffff0) != uVar10);
          auVar18 = vmovdqa32_avx512f(auVar19);
          auVar19._0_4_ =
               (uint)(bVar7 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
          bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar19._4_4_ = (uint)bVar3 * auVar18._4_4_ | (uint)!bVar3 * auVar20._4_4_;
          bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar19._8_4_ = (uint)bVar3 * auVar18._8_4_ | (uint)!bVar3 * auVar20._8_4_;
          bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar19._12_4_ = (uint)bVar3 * auVar18._12_4_ | (uint)!bVar3 * auVar20._12_4_;
          bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar19._16_4_ = (uint)bVar3 * auVar18._16_4_ | (uint)!bVar3 * auVar20._16_4_;
          bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar19._20_4_ = (uint)bVar3 * auVar18._20_4_ | (uint)!bVar3 * auVar20._20_4_;
          bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar19._24_4_ = (uint)bVar3 * auVar18._24_4_ | (uint)!bVar3 * auVar20._24_4_;
          bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar19._28_4_ = (uint)bVar3 * auVar18._28_4_ | (uint)!bVar3 * auVar20._28_4_;
          auVar19._32_4_ =
               (uint)(bVar8 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar19._36_4_ = (uint)bVar3 * auVar18._36_4_ | (uint)!bVar3 * auVar20._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar19._40_4_ = (uint)bVar3 * auVar18._40_4_ | (uint)!bVar3 * auVar20._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar19._44_4_ = (uint)bVar3 * auVar18._44_4_ | (uint)!bVar3 * auVar20._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar19._48_4_ = (uint)bVar3 * auVar18._48_4_ | (uint)!bVar3 * auVar20._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar19._52_4_ = (uint)bVar3 * auVar18._52_4_ | (uint)!bVar3 * auVar20._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar19._56_4_ = (uint)bVar3 * auVar18._56_4_ | (uint)!bVar3 * auVar20._56_4_;
          auVar19._60_4_ =
               (uint)(bVar8 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar19,1);
          auVar18 = vpmulld_avx512f(auVar19,ZEXT3264(auVar15));
          auVar4 = vpmulld_avx(auVar18._0_16_,auVar18._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          iVar23 = auVar4._0_4_;
        }
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = pTVar2->v + (uVar13 % (pTVar2->d).bd) * iVar23;
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)(pTVar2->d).d[0];
        iVar23 = 1;
        local_50.m_matrix.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(pTVar2->d).d[1];
        if (uVar1 < 2) {
          local_50.m_matrix.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        uVar1 = (fx->d).nd;
        if ((ulong)uVar1 != 0) {
          auVar18 = vpbroadcastq_avx512f();
          uVar10 = 0;
          auVar19 = vpbroadcastd_avx512f(ZEXT416(1));
          do {
            auVar20 = vmovdqa64_avx512f(auVar19);
            auVar19 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar19,auVar16);
            auVar19 = vporq_avx512f(auVar19,auVar17);
            uVar6 = vpcmpuq_avx512f(auVar19,auVar18,2);
            bVar7 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar21,auVar18,2);
            bVar8 = (byte)uVar6;
            uVar14 = CONCAT11(bVar8,bVar7);
            auVar19 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar10));
            auVar22._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar19._4_4_;
            auVar22._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_;
            auVar22._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar19._8_4_;
            auVar22._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar19._12_4_;
            auVar22._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar19._16_4_;
            auVar22._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar19._20_4_;
            auVar22._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar19._24_4_;
            auVar22._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar19._28_4_;
            auVar22._32_4_ = (uint)(bVar8 & 1) * auVar19._32_4_;
            auVar22._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar19._36_4_;
            auVar22._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar19._40_4_;
            auVar22._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar19._44_4_;
            auVar22._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar19._48_4_;
            auVar22._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar19._52_4_;
            auVar22._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar19._56_4_;
            auVar22._60_4_ = (uint)(bVar8 >> 7) * auVar19._60_4_;
            auVar19 = vpmulld_avx512f(auVar22,auVar20);
            uVar10 = uVar10 + 0x10;
          } while (((ulong)uVar1 + 0xf & 0x1fffffff0) != uVar10);
          auVar16 = vmovdqa32_avx512f(auVar19);
          auVar17._0_4_ =
               (uint)(bVar7 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar20._0_4_;
          bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar17._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar20._4_4_;
          bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar17._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar20._8_4_;
          bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar17._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar20._12_4_;
          bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
          auVar17._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar20._16_4_;
          bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
          auVar17._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar20._20_4_;
          bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
          auVar17._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar20._24_4_;
          bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
          auVar17._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar20._28_4_;
          auVar17._32_4_ =
               (uint)(bVar8 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar20._32_4_;
          bVar3 = (bool)(bVar8 >> 1 & 1);
          auVar17._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar20._36_4_;
          bVar3 = (bool)(bVar8 >> 2 & 1);
          auVar17._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar20._40_4_;
          bVar3 = (bool)(bVar8 >> 3 & 1);
          auVar17._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar20._44_4_;
          bVar3 = (bool)(bVar8 >> 4 & 1);
          auVar17._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar20._48_4_;
          bVar3 = (bool)(bVar8 >> 5 & 1);
          auVar17._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar20._52_4_;
          bVar3 = (bool)(bVar8 >> 6 & 1);
          auVar17._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar20._56_4_;
          auVar17._60_4_ =
               (uint)(bVar8 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar20._60_4_;
          auVar15 = vextracti64x4_avx512f(auVar17,1);
          auVar16 = vpmulld_avx512f(auVar17,ZEXT3264(auVar15));
          auVar4 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
          auVar5 = vpshufd_avx(auVar4,0xee);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          auVar5 = vpshufd_avx(auVar4,0x55);
          auVar4 = vpmulld_avx(auVar4,auVar5);
          iVar23 = auVar4._0_4_;
        }
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data = fx->v + (uVar13 % (fx->d).bd) * iVar23;
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value = (long)(fx->d).d[0];
        local_70.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value = (long)(fx->d).d[1];
        if (uVar1 < 2) {
          local_70.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = 1;
        }
        Eigen::internal::
        check_for_aliasing<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>>
                  (&local_70,&local_50);
        if ((local_70.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value !=
             local_50.m_matrix.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value) ||
           (local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value !=
            local_50.m_matrix.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value)) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                       );
        }
        auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        if (0 < local_70.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value) {
          uVar10 = 0;
          do {
            if (0 < local_70.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_rows.m_value) {
              uVar12 = 0;
              pfVar11 = local_50.m_matrix.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
              do {
                local_70.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data[uVar12] = *pfVar11;
                uVar12 = uVar12 + 1;
                pfVar11 = pfVar11 + local_50.m_matrix.
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                    .
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                    .m_rows.m_value;
              } while (local_70.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_rows.m_value != uVar12);
            }
            uVar10 = uVar10 + 1;
            local_50.m_matrix.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = local_50.m_matrix.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data + 1;
            local_70.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_data = local_70.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data + local_70.
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                .
                                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                .m_rows.m_value;
          } while (uVar10 != local_70.
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                             .
                             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                             .m_cols.m_value);
        }
        uVar13 = uVar13 + 1;
        ppTVar9 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar13 < ((*ppTVar9)->d).bd);
    }
  }
  return;
}

Assistant:

void Transpose::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (dim.rows() == 1 || dim.cols() == 1) {
    fx.v = xs[0]->v;
  } else {
#if HAVE_CUDA
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      CUBLAS_CHECK(cublasSgeam(cublas_handle, CUBLAS_OP_T, CUBLAS_OP_N, fx.d.rows(), fx.d.cols(),
                               kSCALAR_ONE, xs[0]->batch_ptr(b), xs[0]->d.rows(), kSCALAR_ZERO, NULL, fx.d.rows(), fx.batch_ptr(b), fx.d.rows()));
#else
    for(unsigned b = 0; b < xs[0]->d.bd; ++b)
      fx.batch_matrix(b).noalias() = xs[0]->batch_matrix(b).transpose();
#endif
  }
}